

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall cbtGImpactMeshShape::calcLocalAABB(cbtGImpactMeshShape *this)

{
  undefined8 uVar1;
  long lVar2;
  cbtGImpactMeshShapePart *pcVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5._8_4_ = 0x7f7fffff;
  auVar5._0_8_ = 0x7f7fffff7f7fffff;
  auVar5._12_4_ = 0x7f7fffff;
  auVar6._8_4_ = 0xff7fffff;
  auVar6._0_8_ = 0xff7fffffff7fffff;
  auVar6._12_4_ = 0xff7fffff;
  uVar1 = vmovlps_avx(auVar5);
  *(undefined8 *)(this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats = uVar1;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_min.m_floats[2] = 3.4028235e+38;
  uVar1 = vmovlps_avx(auVar6);
  *(undefined8 *)(this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats = uVar1;
  (this->super_cbtGImpactShapeInterface).m_localAABB.m_max.m_floats[2] = -3.4028235e+38;
  lVar2 = (long)(this->m_mesh_parts).m_size;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    pcVar3 = (this->m_mesh_parts).m_data[lVar2];
    if ((pcVar3->super_cbtGImpactShapeInterface).m_needs_update == true) {
      (*(pcVar3->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0x11])(pcVar3);
      (pcVar3->super_cbtGImpactShapeInterface).m_needs_update = false;
      pcVar3 = (this->m_mesh_parts).m_data[lVar2];
    }
    cbtAABB::merge(&(this->super_cbtGImpactShapeInterface).m_localAABB,
                   &(pcVar3->super_cbtGImpactShapeInterface).m_localAABB);
  }
  return;
}

Assistant:

virtual void calcLocalAABB()
	{
		m_localAABB.invalidate();
		int i = m_mesh_parts.size();
		while (i--)
		{
			m_mesh_parts[i]->updateBound();
			m_localAABB.merge(m_mesh_parts[i]->getLocalBox());
		}
	}